

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O0

void __thiscall
Centaurus::Grammar<unsigned_char>::print_catn
          (Grammar<unsigned_char> *this,wostream *os,Identifier *id)

{
  CATNMachine<unsigned_char> *this_00;
  wstring *name;
  undefined1 local_68 [8];
  CompositeATN<unsigned_char> catn;
  Identifier *id_local;
  wostream *os_local;
  Grammar<unsigned_char> *this_local;
  
  catn.m_dict._M_h._M_single_bucket = (__node_base_ptr)id;
  CompositeATN<unsigned_char>::CompositeATN((CompositeATN<unsigned_char> *)local_68,this);
  this_00 = CompositeATN<unsigned_char>::operator[]
                      ((CompositeATN<unsigned_char> *)local_68,
                       (Identifier *)catn.m_dict._M_h._M_single_bucket);
  name = Identifier::str_abi_cxx11_((Identifier *)catn.m_dict._M_h._M_single_bucket);
  CATNMachine<unsigned_char>::print(this_00,os,name);
  CompositeATN<unsigned_char>::~CompositeATN((CompositeATN<unsigned_char> *)local_68);
  return;
}

Assistant:

void Grammar<TCHAR>::print_catn(std::wostream& os, const Identifier& id) const
{
    CompositeATN<TCHAR> catn(*this);

    catn[id].print(os, id.str());
}